

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontNonSym.cpp
# Opt level: O2

void __thiscall
TPZFrontNonSym<float>::ExtractFrontMatrix(TPZFrontNonSym<float> *this,TPZFMatrix<float> *front)

{
  float fVar1;
  long lVar2;
  long *plVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  float *pfVar7;
  long lVar8;
  long lVar9;
  int64_t global;
  
  lVar2 = (this->super_TPZFront<float>).fLocal.fNElements;
  for (global = (this->super_TPZFront<float>).fNextRigidBodyMode; global < lVar2;
      global = global + 1) {
    iVar5 = Local(this,global);
    (this->super_TPZFront<float>).fData.fStore
    [(long)(this->super_TPZFront<float>).fMaxFront * (long)iVar5 + (long)iVar5] = 1.0;
  }
  lVar6 = 0;
  lVar9 = 0;
  if (0 < lVar2) {
    lVar9 = lVar2;
  }
  for (; (lVar8 = lVar9, lVar9 != lVar6 &&
         (lVar8 = lVar6, (this->super_TPZFront<float>).fLocal.fStore[lVar6] == -1));
      lVar6 = lVar6 + 1) {
  }
  (*(front->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xe])
            (front,lVar2 - lVar8);
  for (lVar9 = lVar8; lVar9 < lVar2; lVar9 = lVar9 + 1) {
    if ((this->super_TPZFront<float>).fLocal.fStore[lVar9] != -1) {
      for (lVar6 = 0; lVar2 != lVar6; lVar6 = lVar6 + 1) {
        plVar3 = (this->super_TPZFront<float>).fLocal.fStore;
        lVar4 = plVar3[lVar6];
        if (lVar4 != -1) {
          fVar1 = (this->super_TPZFront<float>).fData.fStore
                  [lVar4 * (this->super_TPZFront<float>).fMaxFront + plVar3[lVar9]];
          pfVar7 = TPZFMatrix<float>::operator()(front,lVar9 - lVar8,lVar6 - lVar8);
          *pfVar7 = fVar1;
        }
      }
    }
  }
  return;
}

Assistant:

void TPZFrontNonSym<TVar>::ExtractFrontMatrix(TPZFMatrix<TVar> &front)
{
	// Extend the front with the non initialized rigid body modes
	int64_t ieq;
	int64_t maxeq = this->fLocal.NElements();
	for (ieq = this->fNextRigidBodyMode; ieq< maxeq; ieq++) {
		int ilocal = Local(ieq);
		Element(ilocal, ilocal) = 1.;
	}
	
	int64_t mineq = 0;
	for(mineq=0; mineq<maxeq; mineq++) if(this->fLocal[mineq] != -1) break;
	int64_t numeq = maxeq-mineq;
	front.Redim(numeq,numeq);
	int64_t jeq;
	for(ieq=mineq;ieq<maxeq;ieq++) {
		if(this->fLocal[ieq] == -1) continue;
		int64_t il = ieq-mineq;
		for(jeq=0;jeq<maxeq;jeq++) {
			if(this->fLocal[jeq] == -1) continue;
			int64_t jl = jeq-mineq;
			front(il,jl) = this->Element(this->fLocal[ieq],this->fLocal[jeq]);
		}
	}
	
}